

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism.cc
# Opt level: O1

HomomorphismResult *
gss::solve_homomorphism_problem
          (HomomorphismResult *__return_storage_ptr__,InputGraph *pattern,InputGraph *target,
          HomomorphismParams *params)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  _Rb_tree_color _Var3;
  RestartsSchedule RVar4;
  _Rb_tree_color __val;
  undefined1 auVar5 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  DuplicateSolutionFilterer DVar7;
  DuplicateSolutionFilterer DVar8;
  undefined1 auVar9 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  HomomorphismParams *pHVar11;
  pointer ptVar12;
  pointer ptVar13;
  string sVar14;
  string sVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  SearchResult SVar20;
  uint uVar21;
  uint uVar22;
  undefined8 uVar23;
  _Base_ptr p_Var24;
  _Node *p_Var25;
  long lVar26;
  void *pvVar27;
  HomomorphismParams *pHVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  _List_node_base *p_Var30;
  long lVar31;
  mapped_type *pmVar32;
  _List_node_base *p_Var33;
  UnsupportedConfiguration *pUVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  uint uVar36;
  HomomorphismParams *extraout_RDX;
  HomomorphismParams *extraout_RDX_00;
  HomomorphismParams *pHVar37;
  size_t sVar38;
  int iVar39;
  uint uVar40;
  thread *th;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar41;
  ulong uVar42;
  HomomorphismParams *pHVar43;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  ulong uVar44;
  int q;
  uint uVar45;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  atomic<bool> restart_synchroniser;
  HomomorphismAssignments assignments_copy;
  Domains domains;
  string __str;
  string by_thread_nodes;
  function<void_(unsigned_int)> work_function;
  vector<int,_std::allocator<int>_> cancel_out;
  string by_thread_propagations;
  string __str_4;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  bool done;
  string __str_3;
  HomomorphismAssignments assignments;
  HomomorphismModel model;
  vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
  searchers;
  vector<int,_std::allocator<int>_> permitted;
  undefined1 local_1739;
  undefined1 local_1738 [8];
  undefined1 auStack_1730 [16];
  _Base_ptr p_Stack_1720;
  _Base_ptr local_1718;
  size_t local_1710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1700;
  InputGraph *local_16e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  undefined8 local_16b8;
  undefined1 local_16a8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1698;
  HomomorphismParams *local_1690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1688;
  _Any_data local_1668;
  shared_ptr<gss::innards::Proof> sStack_1658;
  undefined1 local_1648 [8];
  _Rb_tree_node_base _Stack_1640;
  undefined1 local_1620 [16];
  unsigned_long_long local_1610;
  undefined1 local_1608 [16];
  _List_node_base *local_15f8;
  data_type local_15e8;
  uint local_15d8;
  undefined2 local_15d4;
  bool local_15d2;
  bool local_15c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1598;
  vector<std::thread,_std::allocator<std::thread>_> local_1578;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  local_1558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1520;
  undefined1 local_1518 [40];
  _Base_ptr local_14f0;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *local_14e8;
  HomomorphismModel local_14e0;
  long local_1498;
  vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
  local_1490;
  pointer local_1478;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1470;
  undefined1 local_1468 [16];
  undefined1 auStack_1458 [12];
  undefined1 uStack_144c;
  undefined3 uStack_144b;
  undefined4 local_1448;
  undefined4 uStack_1444;
  undefined8 local_1440;
  Proof aPStack_1438 [2];
  _Any_data local_1428 [2];
  _Optional_payload_base<gss::ProofOptions> local_1408;
  element_type *local_13b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_13b0;
  bool local_13a8;
  bool local_13a0;
  _List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
  local_a0;
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  local_80;
  _List_node_base local_68;
  size_t local_58;
  _List_node_base local_50;
  size_t local_40;
  
  local_16a8 = ZEXT816(0);
  local_16e0 = pattern;
  if ((params->proof_options).super__Optional_base<gss::ProofOptions,_false,_false>._M_payload.
      super__Optional_payload<gss::ProofOptions,_true,_false,_false>.
      super__Optional_payload_base<gss::ProofOptions>._M_engaged == true) {
    if (params->n_threads != 1) {
      pUVar34 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = auStack_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used with threads","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar34,(string *)local_1468);
      __cxa_throw(pUVar34,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if (params->clique_detection == true) {
      pUVar34 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = auStack_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,
                 "Proof logging cannot yet be used with clique detection, use --no-clique-detection"
                 ,"");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar34,(string *)local_1468);
      __cxa_throw(pUVar34,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((params->lackey)._M_t.
        super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t
        .super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
        super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl != (Lackey *)0x0) {
      pUVar34 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = auStack_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used with a lackey","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar34,(string *)local_1468);
      __cxa_throw(pUVar34,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if (((params->pattern_less_constraints).
         super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&params->pattern_less_constraints) ||
       ((params->target_occur_less_constraints).
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next !=
        (_List_node_base *)&params->target_occur_less_constraints)) {
      pUVar34 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = auStack_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used with less-constraints","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar34,(string *)local_1468);
      __cxa_throw(pUVar34,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((params->injectivity & ~NonInjective) != Injective) {
      pUVar34 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = auStack_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,
                 "Proof logging can currently only be used with injectivity or non-injectivity","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar34,(string *)local_1468);
      __cxa_throw(pUVar34,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    bVar16 = InputGraph::has_vertex_labels(pattern);
    if ((bVar16) || (bVar16 = InputGraph::has_edge_labels(pattern), bVar16)) {
      pUVar34 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = auStack_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used on labelled graphs","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar34,(string *)local_1468);
      __cxa_throw(pUVar34,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    auVar48._24_8_ = 0;
    auVar48._0_24_ = stack0xffffffffffffeba0;
    _local_1468 = (string)(auVar48 << 0x40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gss::innards::Proof,std::allocator<gss::innards::Proof>,gss::ProofOptions_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1468 + 8),(Proof **)local_1468,
               (allocator<gss::innards::Proof> *)local_1648,(ProofOptions *)&params->proof_options);
    auVar47 = local_1468;
    local_1468 = ZEXT816(0);
    uVar23 = local_16a8._8_8_;
    local_16a8 = auVar47;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar23);
    }
    local_1690 = params;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_);
    }
    iVar39 = 0;
    while( true ) {
      iVar17 = InputGraph::size(pattern);
      pattern = local_16e0;
      uVar23 = local_16a8._0_8_;
      if (iVar17 <= iVar39) break;
      iVar17 = InputGraph::size(target);
      local_1468._8_8_ = 0;
      local_1468._0_8_ = local_16e0;
      auStack_1458._0_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:438:17)>
           ::_M_manager;
      stack0xffffffffffffebb0 =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:438:17)>
           ::_M_invoke;
      _Stack_1640._0_8_ = 0;
      local_1648 = (undefined1  [8])target;
      _Stack_1640._M_parent =
           (_Base_ptr)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:439:17)>
           ::_M_manager;
      _Stack_1640._M_left =
           (_Base_ptr)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:439:17)>
           ::_M_invoke;
      innards::Proof::create_cp_variable
                ((Proof *)uVar23,iVar39,iVar17,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)local_1468,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)local_1648);
      if (_Stack_1640._M_parent != (_Base_ptr)0x0) {
        (*(code *)_Stack_1640._M_parent)
                  ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1648,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1648,3);
      }
      pattern = local_16e0;
      if (auStack_1458._0_8_ != 0) {
        (*(code *)auStack_1458._0_8_)
                  ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1468,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1468,3);
      }
      iVar39 = iVar39 + 1;
    }
    if (local_1690->injectivity == Injective) {
      iVar39 = InputGraph::size(local_16e0);
      iVar17 = InputGraph::size(target);
      innards::Proof::create_injectivity_constraints((Proof *)uVar23,iVar39,iVar17);
    }
    for (iVar39 = 0; iVar17 = InputGraph::size(pattern), iVar39 < iVar17; iVar39 = iVar39 + 1) {
      iVar17 = 0;
      while (local_14e0._imp._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl.
             _0_4_ = iVar17, iVar18 = InputGraph::size(target), iVar17 < iVar18) {
        innards::Proof::start_adjacency_constraints_for
                  ((Proof *)local_16a8._0_8_,iVar39,
                   (int)local_14e0._imp._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl);
        for (iVar17 = 0; iVar18 = InputGraph::size(pattern), iVar17 < iVar18; iVar17 = iVar17 + 1) {
          bVar16 = InputGraph::adjacent(pattern,iVar39,iVar17);
          if (bVar16) {
            iVar18 = 0;
            auStack_1458._0_8_ = (_Manager_type)0x0;
            local_1468 = ZEXT816(0) << 0x40;
            _Stack_1640._M_parent = (_Base_ptr)0x0;
            _local_1648 = (_Any_data)(ZEXT816(0) << 0x40);
            while( true ) {
              local_1738._0_4_ = iVar18;
              iVar19 = InputGraph::size(target);
              if (iVar19 <= iVar18) break;
              bVar16 = InputGraph::adjacent
                                 (target,(int)local_14e0._imp._M_t.
                                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              .
                                              super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl,local_1738._0_4_);
              if (bVar16) {
                if (local_1468._8_8_ == auStack_1458._0_8_) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_1468,
                             (iterator)local_1468._8_8_,(int *)local_1738);
                }
                else {
                  *(undefined4 *)local_1468._8_8_ = local_1738._0_4_;
                  local_1468._8_8_ = (int *)(local_1468._8_8_ + 4);
                }
                if ((int)local_14e0._imp._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                         _M_head_impl == local_1738._0_4_) {
                  if ((_Base_ptr)_Stack_1640._0_8_ == _Stack_1640._M_parent) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_1648,
                               (iterator)_Stack_1640._0_8_,(int *)&local_14e0);
                  }
                  else {
                    *(int *)_Stack_1640._0_8_ =
                         (int)local_14e0._imp._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                              _M_head_impl;
                    _Stack_1640._0_8_ = (int *)(_Stack_1640._0_8_ + 4);
                  }
                }
              }
              iVar18 = local_1738._0_4_ + 1;
            }
            innards::Proof::create_adjacency_constraint
                      ((Proof *)local_16a8._0_8_,iVar39,iVar17,
                       (int)local_14e0._imp._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl,(vector<int,_std::allocator<int>_> *)local_1468,
                       (vector<int,_std::allocator<int>_> *)local_1648,false);
            if (local_1648 != (undefined1  [8])0x0) {
              operator_delete((void *)local_1648,(long)_Stack_1640._M_parent - (long)local_1648);
            }
            pattern = local_16e0;
            if ((Proof *)local_1468._0_8_ != (Proof *)0x0) {
              operator_delete((void *)local_1468._0_8_,auStack_1458._0_8_ - local_1468._0_8_);
            }
          }
        }
        if (local_1690->induced == true) {
          for (iVar17 = 0; iVar18 = InputGraph::size(pattern), iVar17 < iVar18; iVar17 = iVar17 + 1)
          {
            if ((iVar17 != iVar39) &&
               (bVar16 = InputGraph::adjacent(pattern,iVar39,iVar17), sVar14 = _local_1468, !bVar16)
               ) {
              local_1468 = ZEXT816(0);
              stack0xffffffffffffebb0 = sVar14.field_2._8_8_;
              auStack_1458._0_8_ = (_Manager_type)0x0;
              iVar18 = 0;
              while( true ) {
                local_1648._0_4_ = iVar18;
                iVar19 = InputGraph::size(target);
                if (iVar19 <= iVar18) break;
                if (((int)local_14e0._imp._M_t.
                          super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl != local_1648._0_4_) &&
                   (bVar16 = InputGraph::adjacent
                                       (target,(int)local_14e0._imp._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl,local_1648._0_4_), !bVar16)) {
                  if (local_1468._8_8_ == auStack_1458._0_8_) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_1468,
                               (iterator)local_1468._8_8_,(int *)local_1648);
                  }
                  else {
                    *(undefined4 *)local_1468._8_8_ = local_1648._0_4_;
                    local_1468._8_8_ = (int *)(local_1468._8_8_ + 4);
                  }
                }
                iVar18 = local_1648._0_4_ + 1;
              }
              _Stack_1640._M_parent = (_Base_ptr)0x0;
              _local_1648 = (_Any_data)(ZEXT816(0) << 0x40);
              innards::Proof::create_adjacency_constraint
                        ((Proof *)local_16a8._0_8_,iVar39,iVar17,
                         (int)local_14e0._imp._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                              _M_head_impl,(vector<int,_std::allocator<int>_> *)local_1468,
                         (vector<int,_std::allocator<int>_> *)local_1648,true);
              if (local_1648 != (undefined1  [8])0x0) {
                operator_delete((void *)local_1648,(long)_Stack_1640._M_parent - (long)local_1648);
              }
              pattern = local_16e0;
              if ((Proof *)local_1468._0_8_ != (Proof *)0x0) {
                operator_delete((void *)local_1468._0_8_,auStack_1458._0_8_ - local_1468._0_8_);
              }
            }
          }
        }
        iVar17 = (int)local_14e0._imp._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl + 1;
      }
    }
    innards::Proof::finalise_model((Proof *)local_16a8._0_8_);
    params = local_1690;
  }
  bVar16 = innards::is_nonshrinking(params);
  if (bVar16) {
    iVar39 = InputGraph::size(pattern);
    iVar17 = InputGraph::size(target);
    if (iVar17 < iVar39) {
      if ((Proof *)local_16a8._0_8_ != (Proof *)0x0) {
        innards::Proof::failure_due_to_pattern_bigger_than_target((Proof *)local_16a8._0_8_);
        innards::Proof::finish_unsat_proof((Proof *)local_16a8._0_8_);
      }
      p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
      auVar47 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])
       &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           ZEXT1632(auVar47);
      *(undefined1 (*) [32])&(__return_storage_ptr__->mapping)._M_t._M_impl = ZEXT1632(auVar47);
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      auVar48 = ZEXT1632(auVar47);
      __return_storage_ptr__->propagations = auVar48._0_8_;
      __return_storage_ptr__->extra_stats =
           (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )auVar48._8_24_;
      *(undefined1 (*) [32])
       &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = auVar48
      ;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)&__return_storage_ptr__->extra_stats;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)&__return_storage_ptr__->extra_stats;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      __return_storage_ptr__->complete = false;
      goto LAB_0011bee7;
    }
  }
  if (((((params->injectivity == NonInjective) &&
        (bVar16 = InputGraph::has_vertex_labels(pattern), !bVar16)) &&
       (bVar16 = InputGraph::has_edge_labels(pattern), !bVar16)) &&
      ((bVar16 = InputGraph::loopy(target), bVar16 && (params->count_solutions == false)))) &&
     ((params->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0)) {
    p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    plVar46 = &__return_storage_ptr__->extra_stats;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->nodes = 0;
    __return_storage_ptr__->propagations = 0;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar46;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar46;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    __return_storage_ptr__->complete = false;
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[27]>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)plVar46,
               (char (*) [27])"used_loops_property = true");
    __return_storage_ptr__->complete = true;
    local_1468._0_4_ = 0xffffffff;
    for (iVar39 = 0; iVar17 = InputGraph::size(target), iVar39 < iVar17; iVar39 = iVar39 + 1) {
      bVar16 = InputGraph::adjacent(target,iVar39,iVar39);
      if (bVar16) {
        local_1468._0_4_ = iVar39;
        break;
      }
    }
    iVar39 = 0;
    while( true ) {
      local_1648._0_4_ = iVar39;
      iVar17 = InputGraph::size(pattern);
      if (iVar17 <= iVar39) break;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<int&,int&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)__return_storage_ptr__,(int *)local_1648,(int *)local_1468);
      iVar39 = local_1648._0_4_ + 1;
    }
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
    ::operator++(&__return_storage_ptr__->solution_count);
    goto LAB_0011bee7;
  }
  bVar16 = innards::can_use_clique(params);
  if ((bVar16) && (bVar16 = innards::is_simple_clique(pattern), bVar16)) {
    uStack_144c = 0;
    sVar14 = _local_1468;
    uStack_1444 = uStack_1444 & 0xffffff00;
    local_1440 = (__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                  )0x0;
    local_1468 = ZEXT816(0);
    stack0xffffffffffffebb0 = sVar14.field_2._8_8_;
    auStack_1458._0_8_ = (_Manager_type)0x0;
    aPStack_1438[0]._imp._M_t.
    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>.
    _M_t.
    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl =
         (unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>)
         (__uniq_ptr_data<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>,_true,_true>
          )0x1ffffffff;
    aPStack_1438[1]._imp._M_t.
    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>.
    _M_t.
    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl._0_1_ = false;
    local_1428[0]._M_unused._M_object = (void *)0x0;
    local_1428[0]._8_8_ = 0;
    local_1428[1]._0_8_ = (_Manager_type)0x0;
    local_1428[1]._8_8_ = (_Invoker_type)0x0;
    local_1408._M_engaged = false;
    local_13a0 = false;
    local_13b8 = (element_type *)0x0;
    _Stack_13b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_13a8 = false;
    local_1468._0_8_ =
         (params->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1468 + 8),
               &(params->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    auStack_1458._0_8_ = (_Manager_type)(params->start_time).__d.__r;
    iVar39 = InputGraph::size(pattern);
    sVar14 = _local_1468;
    auStack_1458._8_4_ = iVar39;
    sVar15 = _local_1468;
    uStack_144c = sVar14.field_2._12_1_;
    bVar16 = (bool)uStack_144c == false;
    _local_1468 = sVar15;
    if (bVar16) {
      uStack_144b = sVar14.field_2._13_3_;
      uStack_144c = 1;
    }
    uVar23 = operator_new(8);
    *(undefined ***)uVar23 = &PTR__RestartsSchedule_001e52d0;
    if ((_Head_base<0UL,_gss::RestartsSchedule_*,_false>)local_1440 !=
        (_Head_base<0UL,_gss::RestartsSchedule_*,_false>)0x0) {
      RVar4._vptr_RestartsSchedule = *(_func_int ***)local_1440;
      local_1440 = uVar23;
      (*RVar4._vptr_RestartsSchedule[1])();
      uVar23 = local_1440;
    }
    local_1440 = uVar23;
    solve_clique_problem((CliqueResult *)local_1648,target,(CliqueParams *)local_1468);
    p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    iVar39 = 0;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    plVar46 = &__return_storage_ptr__->extra_stats;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->nodes = 0;
    __return_storage_ptr__->propagations = 0;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar46;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar46;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    __return_storage_ptr__->complete = false;
    if (_Stack_1640._M_left != (_Rb_tree_node_base *)(local_1648 + 8)) {
      p_Var24 = _Stack_1640._M_left;
      do {
        local_14e0._imp._M_t.
        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ._M_t.
        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl._0_4_ =
             iVar39;
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int,int_const&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,(int *)&local_14e0,(int *)(p_Var24 + 1));
        iVar17 = InputGraph::size(local_16e0);
        iVar39 = iVar39 + 1;
        if (iVar17 <= iVar39) break;
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
      } while (p_Var24 != (_Rb_tree_node_base *)(local_1648 + 8));
    }
    __return_storage_ptr__->nodes = local_1620._8_8_;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(plVar46,(_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(local_1608 + 8));
    p_Var25 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_create_node<char_const(&)[26]>
                        ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)plVar46,
                         (char (*) [26])"used_clique_solver = true");
    std::__detail::_List_node_base::_M_hook(&p_Var25->super__List_node_base);
    psVar2 = &(__return_storage_ptr__->extra_stats).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    __return_storage_ptr__->complete = (bool)local_15e8.ld.capacity._0_1_;
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_1608 + 8));
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_1648);
    if (_Stack_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_13b0._M_pi);
    }
    if (local_1408._M_engaged == true) {
      std::_Optional_payload_base<gss::ProofOptions>::_M_destroy(&local_1408);
    }
    if ((_Manager_type)local_1428[1]._0_8_ != (_Manager_type)0x0) {
      (*(code *)local_1428[1]._0_8_)(local_1428,local_1428,3);
    }
    if ((RestartsSchedule *)local_1440 != (RestartsSchedule *)0x0) {
      (*(*(_func_int ***)local_1440)[1])();
    }
    local_1440 = (_Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                  )0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_);
    }
    goto LAB_0011bee7;
  }
  innards::HomomorphismModel::HomomorphismModel
            (&local_14e0,target,pattern,params,(shared_ptr<gss::innards::Proof> *)local_16a8);
  bVar16 = innards::HomomorphismModel::prepare(&local_14e0);
  p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  plVar46 = &__return_storage_ptr__->extra_stats;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->nodes = 0;
  __return_storage_ptr__->propagations = 0;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar46;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar46;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  __return_storage_ptr__->complete = false;
  if (bVar16) {
    local_14e8 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&__return_storage_ptr__->solution_count;
    local_14f0 = &p_Var1->_M_header;
    if (params->n_threads == 1) {
      sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_16a8._0_8_;
      sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_16a8._8_8_ + 8) = *(_Atomic_word *)(local_16a8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_16a8._8_8_ + 8) = *(_Atomic_word *)(local_16a8._8_8_ + 8) + 1;
        }
      }
      _Stack_1640._M_right = (_Base_ptr)(local_1648 + 8);
      _Stack_1640._M_color = 0;
      _Stack_1640._M_parent = (_Base_ptr)0x0;
      _Stack_1640._M_left = _Stack_1640._M_right;
      local_1608._0_8_ = local_1608;
      local_1620 = ZEXT816(0) << 0x20;
      local_1610 = 0;
      local_15f8 = (_List_node_base *)0x0;
      local_15e8.la[0] = 0;
      local_15d8 = 1;
      local_15d4._0_1_ = false;
      local_15d4._1_1_ = true;
      local_15d2 = false;
      local_15c8 = false;
      local_1468[8] = 0;
      local_1668._M_unused._M_object = &local_14e0;
      local_1668._8_8_ = params;
      local_1608._8_8_ = local_1608._0_8_;
      innards::SVOBitset::SVOBitset((SVOBitset *)auStack_1458,local_14e0.target_size,0);
      std::
      vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
      vector((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              *)&local_1700,(ulong)local_14e0.pattern_size,(value_type *)local_1468,
             (allocator_type *)local_1738);
      local_1520 = plVar46;
      if ((0x10 < (uint)local_1408._M_payload._48_4_) && (auStack_1458._0_8_ != 0)) {
        operator_delete__((void *)auStack_1458._0_8_);
      }
      bVar16 = innards::HomomorphismModel::initialise_domains
                         ((HomomorphismModel *)local_1668._M_unused._0_8_,
                          (vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                           *)&local_1700);
      if (bVar16) {
        local_1518._0_8_ = (pointer)0x0;
        local_1518._8_8_ = (pointer)0x0;
        local_1518._16_8_ = (pointer)0x0;
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::reserve((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   *)local_1518,(ulong)*(uint *)(local_1668._M_unused._M_function_pointer + 0xc));
        lVar26 = std::chrono::_V2::steady_clock::now();
        local_1558.
        super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
        _local_1738 = (_Any_data)ZEXT816(0);
        auStack_1730._8_8_ =
             std::
             _Function_handler<bool_(const_gss::innards::HomomorphismAssignments_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:106:32)>
             ::_M_manager;
        p_Stack_1720 = (_Base_ptr)
                       std::
                       _Function_handler<bool_(const_gss::innards::HomomorphismAssignments_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:106:32)>
                       ::_M_invoke;
        innards::HomomorphismSearcher::HomomorphismSearcher
                  ((HomomorphismSearcher *)local_1468,
                   (HomomorphismModel *)local_1668._M_unused._0_8_,
                   (HomomorphismParams *)local_1668._8_8_,(DuplicateSolutionFilterer *)local_1738,
                   &sStack_1658);
        if ((_Base_ptr)auStack_1730._8_8_ != (_Base_ptr)0x0) {
          (*(code *)auStack_1730._8_8_)(local_1738,local_1738,3);
        }
        uVar40 = 0;
        while ((char)local_1558.
                     super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                     ._M_impl.super__Vector_impl_data._M_start == '\0') {
          uVar40 = uVar40 + 1;
          auStack_1730._0_8_ = &local_1558;
          local_1738 = (undefined1  [8])&local_1700;
          p_Var33 = &local_68;
          while (p_Var33 = p_Var33->_M_next, p_Var33 != &local_68) {
            bVar16 = innards::
                     Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                     ::
                     apply_one_new_nogood<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignment_const&)_1_>
                               ((Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                                 *)&local_a0,(iterator *)(p_Var33 + 1),
                                (anon_class_16_2_c26f802a *)local_1738);
            if (bVar16) goto LAB_0011a65a;
          }
          p_Var33 = &local_50;
          while (p_Var33 = p_Var33->_M_next, p_Var33 != &local_50) {
            bVar16 = innards::
                     Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                     ::
                     apply_one_new_nogood<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignment_const&)_1_>
                               ((Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                                 *)&local_a0,(iterator *)(p_Var33 + 1),
                                (anon_class_16_2_c26f802a *)local_1738);
            if (bVar16) goto LAB_0011a65a;
          }
          local_1558.
          super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
          p_Var33 = local_68._M_next;
          while (p_Var33 != &local_68) {
            p_Var30 = p_Var33->_M_next;
            operator_delete(p_Var33,0x18);
            p_Var33 = p_Var30;
          }
          local_58 = 0;
          p_Var33 = local_50._M_next;
          local_68._M_next = &local_68;
          local_68._M_prev = &local_68;
          if (local_50._M_next != &local_50) {
            do {
              p_Var30 = p_Var33->_M_next;
              operator_delete(p_Var33,0x18);
              p_Var33 = p_Var30;
            } while (p_Var30 != &local_50);
          }
          local_50._M_next = &local_50;
          local_40 = 0;
          local_1610 = local_1610 + 1;
          local_50._M_prev = local_50._M_next;
          bVar16 = innards::HomomorphismSearcher::propagate
                             ((HomomorphismSearcher *)local_1468,true,(Domains *)&local_1700,
                              (HomomorphismAssignments *)local_1518,
                              *(PropagateUsingLackey *)(local_1668._8_8_ + 0xcc) != Never);
          if (bVar16) {
            std::
            vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ::vector((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      *)local_1738,
                     (vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      *)local_1518);
            SVar20 = innards::HomomorphismSearcher::restarting_search
                               ((HomomorphismSearcher *)local_1468,
                                (HomomorphismAssignments *)local_1738,(Domains *)&local_1700,
                                (unsigned_long_long *)(local_1620 + 8),&local_1610,
                                (loooong *)&local_15e8.ld,0,
                                (((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                                   *)(local_1668._8_8_ + 0x50))->_M_t).
                                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)
            ;
            switch(SVar20) {
            case Aborted:
              local_1558.
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\x01';
              break;
            case Satisfiable:
              innards::HomomorphismSearcher::save_result
                        ((HomomorphismSearcher *)local_1468,(HomomorphismAssignments *)local_1738,
                         (HomomorphismResult *)local_1648);
            case Unsatisfiable:
            case UnsatisfiableAndBackjumpUsingLackey:
            case SatisfiableButKeepGoing:
              local_15c8 = true;
              local_1558.
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\x01';
            }
            if (local_1738 != (undefined1  [8])0x0) {
              operator_delete((void *)local_1738,auStack_1730._8_8_ - (long)local_1738);
            }
          }
          else {
            if (sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Proof *)0x0) {
              innards::Proof::root_propagation_failed
                        (sStack_1658.
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
            }
            local_15c8 = true;
            local_1558.
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\x01';
          }
          (*((((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
              (local_1668._8_8_ + 0x50))->_M_t).
             super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
             .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
            _vptr_RestartsSchedule[3])();
        }
        goto LAB_0011a66a;
      }
      local_15c8 = true;
      innards::HomomorphismModel::add_extra_stats
                ((HomomorphismModel *)local_1668._M_unused._0_8_,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1608);
      goto LAB_0011bd84;
    }
    iVar39 = (*((params->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[5])();
    if ((char)iVar39 == '\0') {
      pUVar34 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = auStack_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Threaded search requires restarts","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar34,(string *)local_1468);
      __cxa_throw(pUVar34,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    uVar40 = innards::how_many_threads(params->n_threads);
    local_16e0 = (InputGraph *)CONCAT44(local_16e0._4_4_,uVar40);
    this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._8_8_;
    local_1478 = (pointer)local_16a8._0_8_;
    p_Stack_1470 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_16a8._8_8_ + 8) = *(_Atomic_word *)(local_16a8._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_16a8._8_8_ + 8) = *(_Atomic_word *)(local_16a8._8_8_ + 8) + 1;
      }
    }
    local_1718 = (_Base_ptr)0x0;
    _local_1738 = (DuplicateSolutionFilterer)(ZEXT832(0) << 0x20);
    _Stack_1640._M_right = (_Base_ptr)(local_1648 + 8);
    _Stack_1640._M_color = 0;
    _Stack_1640._M_parent = (_Base_ptr)0x0;
    _Stack_1640._M_left = _Stack_1640._M_right;
    local_1608._0_8_ = local_1608;
    local_1620 = ZEXT816(0) << 0x20;
    local_1610 = 0;
    local_15f8 = (_List_node_base *)0x0;
    local_15e8.la[0] = 0;
    local_15d8 = 1;
    local_15d4._0_1_ = false;
    local_15d4._1_1_ = true;
    local_15d2 = false;
    local_15c8 = false;
    local_1688._M_dataplus._M_p = (pointer)&local_1688.field_2;
    local_1688._M_string_length = 0;
    local_1688.field_2._M_allocated_capacity =
         local_1688.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_15b8._M_dataplus._M_p = (pointer)&local_15b8.field_2;
    local_15b8._M_string_length = 0;
    local_15b8.field_2._M_allocated_capacity =
         local_15b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1468[8] = 0;
    local_1690 = params;
    local_1608._8_8_ = local_1608._0_8_;
    innards::SVOBitset::SVOBitset((SVOBitset *)auStack_1458,local_14e0.target_size,0);
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::vector(&local_1558,(ulong)local_14e0.pattern_size,(value_type *)local_1468,
             (allocator_type *)&local_16d8);
    if ((0x10 < (uint)local_1408._M_payload._48_4_) && (auStack_1458._0_8_ != 0)) {
      operator_delete__((void *)auStack_1458._0_8_);
    }
    bVar16 = innards::HomomorphismModel::initialise_domains(&local_14e0,&local_1558);
    if (bVar16) {
      local_1498 = std::chrono::_V2::steady_clock::now();
      local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((ulong)local_16e0 & 0xffffffff);
      local_1698 = this._M_pi;
      std::vector<std::thread,_std::allocator<std::thread>_>::reserve
                (&local_1578,(size_type)paVar41);
      std::
      vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
      ::vector(&local_1490,(size_type)paVar41,(allocator_type *)local_1468);
      local_1540.field_2._M_local_buf[9] = '\0';
      uVar44 = (long)paVar41 * 0x20 + 0x20U & 0xffffffffffffffc0;
      local_1540._M_string_length = 0;
      local_1540.field_2._M_allocated_capacity = 0;
      local_1540._M_dataplus._M_p = (pointer)paVar41;
      pvVar27 = operator_new__(uVar44);
      memset(pvVar27,0,uVar44);
      local_1598.field_2._M_local_buf[9] = '\0';
      local_1598._M_string_length = 0;
      local_1598.field_2._M_allocated_capacity = 0;
      local_1598._M_dataplus._M_p = (pointer)paVar41;
      local_1540._M_string_length = (size_type)pvVar27;
      pvVar27 = operator_new__(uVar44);
      memset(pvVar27,0,uVar44);
      this._M_pi = local_1698;
      local_1739 = 0;
      local_16d8._M_dataplus._M_p = (pointer)0x0;
      local_16d8._M_string_length = 0;
      local_16d8.field_2._M_allocated_capacity = 0;
      local_16d8.field_2._8_8_ = 0;
      local_16b8 = 0;
      local_1468 = CONCAT88(1,aPStack_1438);
      _local_1468 = (string)ZEXT1632(local_1468);
      local_1448 = 0x3f800000;
      local_1440 = (__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                    )0x0;
      aPStack_1438[0]._imp._M_t.
      super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
      ._M_t.
      super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
      .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl =
           (unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>)
           (__uniq_ptr_data<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>,_true,_true>
            )0x0;
      if (local_1698 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1698->_M_use_count = local_1698->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1698->_M_use_count = local_1698->_M_use_count + 1;
        }
      }
      local_1668._M_unused._M_object = (void *)0x0;
      local_1668._8_8_ = (HomomorphismParams *)0x0;
      sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1598._M_string_length = (size_type)pvVar27;
      local_1668._M_unused._M_object = operator_new(0x90);
      (((HomomorphismModel *)local_1668._M_unused._0_8_)->_imp)._M_t.
      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ._M_t.
      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl =
           (Imp *)&local_1490;
      *(vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
        **)&((HomomorphismModel *)local_1668._M_unused._0_8_)->max_graphs = &local_1558;
      *(vector<std::thread,_std::allocator<std::thread>_> **)
       &((HomomorphismModel *)local_1668._M_unused._0_8_)->target_size = &local_1578;
      (((HomomorphismModel *)local_1668._M_unused._0_8_)->pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_1668;
      (((HomomorphismModel *)local_1668._M_unused._0_8_)->pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_14e0;
      (((HomomorphismModel *)local_1668._M_unused._0_8_)->pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1690;
      (((HomomorphismModel *)local_1668._M_unused._0_8_)->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_1478;
      (((HomomorphismModel *)local_1668._M_unused._0_8_)->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_1470;
      *(int *)&(((HomomorphismModel *)local_1668._M_unused._0_8_)->
               target_occur_less_thans_in_convenient_order).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage = (int)local_16e0;
      (((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->_imp)._M_t.
      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ._M_t.
      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl =
           (Imp *)local_1648;
      *(undefined1 **)&((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->max_graphs
           = local_1738;
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
       &((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->target_size = &local_1688;
      (((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->
      pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_15b8;
      (((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->
      pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_1540;
      (((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->
      pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_1598;
      (((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_1739;
      (((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1468;
      (((HomomorphismModel *)((long)local_1668._M_unused._0_8_ + 0x48))->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_16d8;
      sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::
              _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:250:17)>
              ::_M_invoke;
      sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           std::
           _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:250:17)>
           ::_M_manager;
      if (local_1690->delay_thread_creation == false) {
        p_Var6 = local_1698;
        pHVar28 = (HomomorphismParams *)
                  local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar43 = (HomomorphismParams *)
                  local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_1520 = plVar46;
        if ((int)local_16e0 != 0) {
          iVar39 = 0;
          pHVar37 = local_1690;
          do {
            ptVar13 = local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            ptVar12 = local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_1700._M_dataplus._M_p._0_4_ = iVar39;
            local_1700._M_string_length = (size_type)&local_1668;
            if (local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              if ((long)local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar42 = (long)local_1578.
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_1578.
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3;
              uVar44 = uVar42 + (uVar42 == 0);
              local_1690 = (HomomorphismParams *)(uVar44 + uVar42);
              if ((HomomorphismParams *)0xffffffffffffffe < local_1690) {
                local_1690 = (HomomorphismParams *)0xfffffffffffffff;
              }
              if (CARRY8(uVar44,uVar42)) {
                local_1690 = (HomomorphismParams *)0xfffffffffffffff;
              }
              if (local_1690 == (HomomorphismParams *)0x0) {
                pHVar28 = (HomomorphismParams *)0x0;
              }
              else {
                pHVar28 = (HomomorphismParams *)
                          __gnu_cxx::new_allocator<std::thread>::allocate
                                    ((new_allocator<std::thread> *)&local_1578,(size_type)local_1690
                                     ,(void *)0x0);
                pHVar37 = extraout_RDX_00;
              }
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,(anonymous_namespace)::ThreadedSolver::solve()::_lambda()_1_>
                        ((allocator_type *)
                         (&(pHVar28->timeout).
                           super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                         uVar42),(thread *)&local_1700,
                         (anon_class_16_2_f4d75bda_for__M_head_impl *)pHVar37);
              pHVar11 = local_1690;
              pHVar43 = pHVar28;
              for (pHVar37 = (HomomorphismParams *)ptVar12; pHVar37 != (HomomorphismParams *)ptVar13
                  ; pHVar37 = (HomomorphismParams *)
                              &(pHVar37->timeout).
                               super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount) {
                (pHVar43->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                (pHVar43->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (pHVar37->timeout).
                         super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                (pHVar37->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                pHVar43 = (HomomorphismParams *)
                          &(pHVar43->timeout).
                           super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
              }
              if ((HomomorphismParams *)ptVar12 != (HomomorphismParams *)0x0) {
                operator_delete(ptVar12,(long)local_1578.
                                              super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)ptVar12);
              }
              local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)(&(pHVar28->timeout).
                              super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                            (long)pHVar11);
              local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pHVar28;
            }
            else {
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,(anonymous_namespace)::ThreadedSolver::solve()::_lambda()_1_>
                        ((allocator_type *)
                         local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(thread *)&local_1700,
                         (anon_class_16_2_f4d75bda_for__M_head_impl *)pHVar37);
              pHVar28 = extraout_RDX;
              pHVar43 = (HomomorphismParams *)
                        local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)&(pHVar43->timeout).
                           super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            iVar39 = iVar39 + 1;
            pHVar37 = pHVar28;
            p_Var6 = local_1698;
            pHVar28 = (HomomorphismParams *)
                      local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pHVar43 = (HomomorphismParams *)
                      local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          } while (iVar39 != (int)local_16e0);
        }
        for (; ptVar12 = local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish, p_Var10 = local_1698,
            bVar16 = pHVar28 !=
                     (HomomorphismParams *)
                     local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                     _M_impl.super__Vector_impl_data._M_finish, this._M_pi = local_1698,
            local_1698 = p_Var6,
            local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)pHVar43, bVar16;
            pHVar28 = (HomomorphismParams *)
                      &(pHVar28->timeout).
                       super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          std::thread::join();
          p_Var6 = local_1698;
          pHVar43 = (HomomorphismParams *)
                    local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                    .super__Vector_impl_data._M_finish;
          local_1578.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = ptVar12;
          local_1698 = p_Var10;
        }
      }
      else {
        local_1700._M_dataplus._M_p = local_1700._M_dataplus._M_p & 0xffffffff00000000;
        local_1520 = plVar46;
        std::
        _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:250:17)>
        ::_M_invoke(&local_1668,(uint *)&local_1700);
      }
      std::operator+(&local_1700,"by_thread_nodes =",&local_1688);
      p_Var33 = (_List_node_base *)operator_new(0x30);
      p_Var33[1]._M_next = p_Var33 + 2;
      paVar41 = &local_1700.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1700._M_dataplus._M_p == paVar41) {
        p_Var33[2]._M_next = (_List_node_base *)local_1700.field_2._M_allocated_capacity;
        p_Var33[2]._M_prev = (_List_node_base *)local_1700.field_2._8_8_;
      }
      else {
        p_Var33[1]._M_next = (_List_node_base *)local_1700._M_dataplus._M_p;
        p_Var33[2]._M_next = (_List_node_base *)local_1700.field_2._M_allocated_capacity;
      }
      p_Var33[1]._M_prev = (_List_node_base *)local_1700._M_string_length;
      local_1700._M_string_length = 0;
      local_1700.field_2._M_allocated_capacity =
           local_1700.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1700._M_dataplus._M_p = (pointer)paVar41;
      std::__detail::_List_node_base::_M_hook(p_Var33);
      local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1700._M_dataplus._M_p != paVar41) {
        operator_delete(local_1700._M_dataplus._M_p,
                        (ulong)(local_1700.field_2._M_allocated_capacity + 1));
      }
      std::operator+(&local_1700,"by_thread_propagations =",&local_15b8);
      p_Var33 = (_List_node_base *)operator_new(0x30);
      p_Var33[1]._M_next = p_Var33 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1700._M_dataplus._M_p == paVar41) {
        p_Var33[2]._M_next = (_List_node_base *)local_1700.field_2._M_allocated_capacity;
        p_Var33[2]._M_prev = (_List_node_base *)local_1700.field_2._8_8_;
      }
      else {
        p_Var33[1]._M_next = (_List_node_base *)local_1700._M_dataplus._M_p;
        p_Var33[2]._M_next = (_List_node_base *)local_1700.field_2._M_allocated_capacity;
      }
      p_Var33[1]._M_prev = (_List_node_base *)local_1700._M_string_length;
      local_1700._M_string_length = 0;
      local_1700.field_2._M_allocated_capacity =
           local_1700.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1700._M_dataplus._M_p = (pointer)paVar41;
      std::__detail::_List_node_base::_M_hook(p_Var33);
      local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1700._M_dataplus._M_p != paVar41) {
        operator_delete(local_1700._M_dataplus._M_p,local_1700.field_2._M_allocated_capacity + 1);
      }
      lVar26 = std::chrono::_V2::steady_clock::now();
      lVar26 = lVar26 - local_1498;
      uVar44 = lVar26 / 1000000;
      uVar42 = -uVar44;
      if (0 < (long)uVar44) {
        uVar42 = uVar44;
      }
      uVar40 = 1;
      if (9 < uVar42) {
        uVar44 = uVar42;
        uVar21 = 4;
        do {
          uVar40 = uVar21;
          if (uVar44 < 100) {
            uVar40 = uVar40 - 2;
            goto LAB_0011ae0c;
          }
          if (uVar44 < 1000) {
            uVar40 = uVar40 - 1;
            goto LAB_0011ae0c;
          }
          if (uVar44 < 10000) goto LAB_0011ae0c;
          bVar16 = 99999 < uVar44;
          uVar44 = uVar44 / 10000;
          uVar21 = uVar40 + 4;
        } while (bVar16);
        uVar40 = uVar40 + 1;
      }
LAB_0011ae0c:
      local_1518._0_8_ = (pointer)(local_1518 + 0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1518,
                 (ulong)((lVar26 < -999999) + uVar40),'-');
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)(local_1518._0_8_ + (ulong)(lVar26 < -999999)),uVar40,uVar42);
      pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1518,0,0,"search_time = ",0xe);
      plVar46 = local_1520;
      local_1700._M_dataplus._M_p = (pbVar29->_M_dataplus)._M_p;
      paVar35 = &pbVar29->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1700._M_dataplus._M_p == paVar35) {
        local_1700.field_2._M_allocated_capacity = paVar35->_M_allocated_capacity;
        local_1700.field_2._8_8_ = *(undefined8 *)((long)&pbVar29->field_2 + 8);
        local_1700._M_dataplus._M_p = (pointer)paVar41;
      }
      else {
        local_1700.field_2._M_allocated_capacity = paVar35->_M_allocated_capacity;
      }
      local_1700._M_string_length = pbVar29->_M_string_length;
      (pbVar29->_M_dataplus)._M_p = (pointer)paVar35;
      pbVar29->_M_string_length = 0;
      (pbVar29->field_2)._M_local_buf[0] = '\0';
      p_Var33 = (_List_node_base *)operator_new(0x30);
      p_Var33[1]._M_next = p_Var33 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1700._M_dataplus._M_p == paVar41) {
        p_Var33[2]._M_next = (_List_node_base *)local_1700.field_2._M_allocated_capacity;
        p_Var33[2]._M_prev = (_List_node_base *)local_1700.field_2._8_8_;
      }
      else {
        p_Var33[1]._M_next = (_List_node_base *)local_1700._M_dataplus._M_p;
        p_Var33[2]._M_next = (_List_node_base *)local_1700.field_2._M_allocated_capacity;
      }
      p_Var33[1]._M_prev = (_List_node_base *)local_1700._M_string_length;
      local_1700._M_string_length = 0;
      local_1700.field_2._M_allocated_capacity =
           local_1700.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1700._M_dataplus._M_p = (pointer)paVar41;
      std::__detail::_List_node_base::_M_hook(p_Var33);
      local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1700._M_dataplus._M_p != paVar41) {
        operator_delete(local_1700._M_dataplus._M_p,
                        (ulong)(local_1700.field_2._M_allocated_capacity + 1));
      }
      if ((pointer)local_1518._0_8_ != (pointer)(local_1518 + 0x10)) {
        operator_delete((void *)local_1518._0_8_,(ulong)(local_1518._16_8_ + 1));
      }
      if (sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (Proof *)0x0) {
        (*(code *)sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)(&local_1668,&local_1668,3);
      }
      std::
      _Hashtable<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_(anonymous_namespace)::VertexToVertexMappingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_(anonymous_namespace)::VertexToVertexMappingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_1468);
      if (aPStack_1438 != (Proof *)local_1468._0_8_) {
        operator_delete((void *)local_1468._0_8_,local_1468._8_8_ << 3);
      }
      if ((void *)local_1598._M_string_length != (void *)0x0) {
        operator_delete__(local_1598._M_string_length,0x40);
      }
      if ((void *)local_1540._M_string_length != (void *)0x0) {
        operator_delete__(local_1540._M_string_length,0x40);
      }
      std::
      vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
      ::~vector(&local_1490);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_1578);
    }
    else {
      local_15c8 = true;
    }
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::~vector(&local_1558);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
      operator_delete(local_15b8._M_dataplus._M_p,local_15b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1688._M_dataplus._M_p != &local_1688.field_2) {
      operator_delete(local_1688._M_dataplus._M_p,
                      (ulong)(local_1688.field_2._M_allocated_capacity + 1));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
             *)__return_storage_ptr__);
    if (_Stack_1640._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_1640._M_color;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           _Stack_1640._M_parent;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_1640._M_left;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_1640._M_right;
      (_Stack_1640._M_parent)->_M_parent = local_14f0;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_1620._0_8_;
      _Stack_1640._M_parent = (_Base_ptr)0x0;
      _Stack_1640._M_right = (_Base_ptr)(local_1648 + 8);
      _Stack_1640._M_left = _Stack_1640._M_right;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_1620._8_8_;
      local_1620 = auVar5 << 0x40;
    }
    __return_storage_ptr__->nodes = local_1620._8_8_;
    __return_storage_ptr__->propagations = local_1610;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(plVar46,local_1608);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=(local_14e8,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_15e8.ld);
    __return_storage_ptr__->complete = local_15c8;
    if ((local_15d4._1_1_ == false) && (local_15d2 == false)) {
      operator_delete(local_15e8.ld.data,(local_15e8.la[0] & 0xffffffff) << 3);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1608);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)local_1648);
    goto joined_r0x0011be94;
  }
  p_Var25 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_create_node<char_const(&)[25]>
                      ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)plVar46,
                       (char (*) [25])"model_consistent = false");
  std::__detail::_List_node_base::_M_hook(&p_Var25->super__List_node_base);
  psVar2 = &(__return_storage_ptr__->extra_stats).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  __return_storage_ptr__->complete = true;
  if ((Proof *)local_16a8._0_8_ != (Proof *)0x0) {
    innards::Proof::finish_unsat_proof((Proof *)local_16a8._0_8_);
  }
LAB_0011beda:
  innards::HomomorphismModel::~HomomorphismModel(&local_14e0);
LAB_0011bee7:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16a8._8_8_);
  }
  return __return_storage_ptr__;
LAB_0011a65a:
  local_1558.
  super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\x01';
  local_15c8 = true;
LAB_0011a66a:
  iVar39 = (*((((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
               (local_1668._8_8_ + 0x50))->_M_t).
              super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
              .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
             _vptr_RestartsSchedule[5])();
  if ((char)iVar39 != '\0') {
    uVar21 = 1;
    if (9 < uVar40) {
      uVar44 = (ulong)uVar40;
      uVar45 = 4;
      do {
        uVar21 = uVar45;
        uVar36 = (uint)uVar44;
        if (uVar36 < 100) {
          uVar21 = uVar21 - 2;
          goto LAB_0011b16e;
        }
        if (uVar36 < 1000) {
          uVar21 = uVar21 - 1;
          goto LAB_0011b16e;
        }
        if (uVar36 < 10000) goto LAB_0011b16e;
        uVar44 = uVar44 / 10000;
        uVar45 = uVar21 + 4;
      } while (99999 < uVar36);
      uVar21 = uVar21 + 1;
    }
LAB_0011b16e:
    local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_16d8,(ulong)uVar21,'\0');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_16d8._M_dataplus._M_p,(uint)local_16d8._M_string_length,uVar40);
    pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_16d8,0,0,"restarts = ",0xb);
    DVar7 = _local_1738;
    p_Var33 = (_List_node_base *)(local_1738 + 0x10);
    auVar9 = _auStack_1730;
    local_1738 = (undefined1  [8])p_Var33;
    DVar8 = _local_1738;
    local_1738 = (undefined1  [8])(pbVar29->_M_dataplus)._M_p;
    paVar41 = &pbVar29->field_2;
    p_Stack_1720 = (_Base_ptr)DVar7._M_invoker;
    p_Var24 = p_Stack_1720;
    if (local_1738 == (undefined1  [8])paVar41) {
      _local_1738 = DVar8.super__Function_base._M_functor;
      auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
      p_Stack_1720 = (_Base_ptr)*(_Invoker_type *)((long)&pbVar29->field_2 + 8);
    }
    else {
      _local_1738 = (DuplicateSolutionFilterer)CONCAT248(auVar9,local_1738);
      auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
      _local_1738 = (DuplicateSolutionFilterer)CONCAT824(p_Var24,_local_1738);
    }
    auStack_1730._0_8_ = pbVar29->_M_string_length;
    (pbVar29->_M_dataplus)._M_p = (pointer)paVar41;
    pbVar29->_M_string_length = 0;
    (pbVar29->field_2)._M_local_buf[0] = '\0';
    p_Var30 = (_List_node_base *)operator_new(0x30);
    p_Var30[1]._M_next = p_Var30 + 2;
    if (local_1738 == (undefined1  [8])p_Var33) {
      p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
      p_Var30[2]._M_prev = (_List_node_base *)p_Stack_1720;
    }
    else {
      p_Var30[1]._M_next = (_List_node_base *)local_1738;
      p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
    }
    p_Var30[1]._M_prev = (_List_node_base *)auStack_1730._0_8_;
    _local_1738 = ZEXT817(p_Var33);
    std::__detail::_List_node_base::_M_hook(p_Var30);
    local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
    if (local_1738 != (undefined1  [8])p_Var33) {
      operator_delete((void *)local_1738,(ulong)((long)(_Rb_tree_color *)auStack_1730._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
      operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar40 = *(uint *)(local_1668._M_unused._M_function_pointer + 8);
  uVar21 = 1;
  if (9 < uVar40) {
    uVar45 = 4;
    uVar36 = uVar40;
    do {
      uVar21 = uVar45;
      if (uVar36 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_0011b2f8;
      }
      if (uVar36 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_0011b2f8;
      }
      if (uVar36 < 10000) goto LAB_0011b2f8;
      bVar16 = 99999 < uVar36;
      uVar45 = uVar21 + 4;
      uVar36 = uVar36 / 10000;
    } while (bVar16);
    uVar21 = uVar21 + 1;
  }
LAB_0011b2f8:
  local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_16d8,(ulong)uVar21,'\0');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_16d8._M_dataplus._M_p,(uint)local_16d8._M_string_length,uVar40);
  pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_16d8,0,0,"shape_graphs = ",0xf);
  DVar7 = _local_1738;
  p_Var33 = (_List_node_base *)(local_1738 + 0x10);
  auVar9 = _auStack_1730;
  local_1738 = (undefined1  [8])p_Var33;
  DVar8 = _local_1738;
  local_1738 = (undefined1  [8])(pbVar29->_M_dataplus)._M_p;
  paVar41 = &pbVar29->field_2;
  p_Stack_1720 = (_Base_ptr)DVar7._M_invoker;
  p_Var24 = p_Stack_1720;
  if (local_1738 == (undefined1  [8])paVar41) {
    _local_1738 = DVar8.super__Function_base._M_functor;
    auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
    p_Stack_1720 = (_Base_ptr)*(_Invoker_type *)((long)&pbVar29->field_2 + 8);
  }
  else {
    _local_1738 = (DuplicateSolutionFilterer)CONCAT248(auVar9,local_1738);
    auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
    _local_1738 = (DuplicateSolutionFilterer)CONCAT824(p_Var24,_local_1738);
  }
  auStack_1730._0_8_ = pbVar29->_M_string_length;
  (pbVar29->_M_dataplus)._M_p = (pointer)paVar41;
  pbVar29->_M_string_length = 0;
  (pbVar29->field_2)._M_local_buf[0] = '\0';
  p_Var30 = (_List_node_base *)operator_new(0x30);
  p_Var30[1]._M_next = p_Var30 + 2;
  if (local_1738 == (undefined1  [8])p_Var33) {
    p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
    p_Var30[2]._M_prev = (_List_node_base *)p_Stack_1720;
  }
  else {
    p_Var30[1]._M_next = (_List_node_base *)local_1738;
    p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
  }
  p_Var30[1]._M_prev = (_List_node_base *)auStack_1730._0_8_;
  _local_1738 = ZEXT817(p_Var33);
  std::__detail::_List_node_base::_M_hook(p_Var30);
  local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
  if (local_1738 != (undefined1  [8])p_Var33) {
    operator_delete((void *)local_1738,(ulong)((long)(_Rb_tree_color *)auStack_1730._8_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
    operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
  }
  lVar31 = std::chrono::_V2::steady_clock::now();
  lVar31 = lVar31 - lVar26;
  uVar44 = lVar31 / 1000000;
  uVar42 = -uVar44;
  if (0 < (long)uVar44) {
    uVar42 = uVar44;
  }
  uVar40 = 1;
  if (9 < uVar42) {
    uVar44 = uVar42;
    uVar21 = 4;
    do {
      uVar40 = uVar21;
      if (uVar44 < 100) {
        uVar40 = uVar40 - 2;
        goto LAB_0011b4bf;
      }
      if (uVar44 < 1000) {
        uVar40 = uVar40 - 1;
        goto LAB_0011b4bf;
      }
      if (uVar44 < 10000) goto LAB_0011b4bf;
      bVar16 = 99999 < uVar44;
      uVar44 = uVar44 / 10000;
      uVar21 = uVar40 + 4;
    } while (bVar16);
    uVar40 = uVar40 + 1;
  }
LAB_0011b4bf:
  local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_16d8,(ulong)((lVar31 < -999999) + uVar40),'-');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_16d8._M_dataplus._M_p + (lVar31 < -999999),uVar40,uVar42);
  pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_16d8,0,0,"search_time = ",0xe);
  DVar7 = _local_1738;
  auVar9 = _auStack_1730;
  local_1738 = (undefined1  [8])p_Var33;
  DVar8 = _local_1738;
  local_1738 = (undefined1  [8])(pbVar29->_M_dataplus)._M_p;
  paVar41 = &pbVar29->field_2;
  p_Stack_1720 = (_Base_ptr)DVar7._M_invoker;
  p_Var24 = p_Stack_1720;
  if (local_1738 == (undefined1  [8])paVar41) {
    _local_1738 = DVar8.super__Function_base._M_functor;
    auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
    p_Stack_1720 = (_Base_ptr)*(_Invoker_type *)((long)&pbVar29->field_2 + 8);
  }
  else {
    _local_1738 = (DuplicateSolutionFilterer)CONCAT248(auVar9,local_1738);
    auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
    _local_1738 = (DuplicateSolutionFilterer)CONCAT824(p_Var24,_local_1738);
  }
  auStack_1730._0_8_ = pbVar29->_M_string_length;
  (pbVar29->_M_dataplus)._M_p = (pointer)paVar41;
  pbVar29->_M_string_length = 0;
  (pbVar29->field_2)._M_local_buf[0] = '\0';
  p_Var30 = (_List_node_base *)operator_new(0x30);
  p_Var30[1]._M_next = p_Var30 + 2;
  if (local_1738 == (undefined1  [8])p_Var33) {
    p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
    p_Var30[2]._M_prev = (_List_node_base *)p_Stack_1720;
  }
  else {
    p_Var30[1]._M_next = (_List_node_base *)local_1738;
    p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
  }
  p_Var30[1]._M_prev = (_List_node_base *)auStack_1730._0_8_;
  _local_1738 = ZEXT817(p_Var33);
  std::__detail::_List_node_base::_M_hook(p_Var30);
  local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
  if (local_1738 != (undefined1  [8])p_Var33) {
    operator_delete((void *)local_1738,(ulong)((long)(_Rb_tree_color *)auStack_1730._8_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
    operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
  }
  bVar16 = innards::might_have_watches((HomomorphismParams *)local_1668._8_8_);
  if (bVar16) {
    uVar40 = 1;
    if (9 < local_a0._M_impl._M_node._M_size) {
      sVar38 = local_a0._M_impl._M_node._M_size;
      uVar21 = 4;
      do {
        uVar40 = uVar21;
        if (sVar38 < 100) {
          uVar40 = uVar40 - 2;
          goto LAB_0011b68f;
        }
        if (sVar38 < 1000) {
          uVar40 = uVar40 - 1;
          goto LAB_0011b68f;
        }
        if (sVar38 < 10000) goto LAB_0011b68f;
        bVar16 = 99999 < sVar38;
        sVar38 = sVar38 / 10000;
        uVar21 = uVar40 + 4;
      } while (bVar16);
      uVar40 = uVar40 + 1;
    }
LAB_0011b68f:
    local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_16d8,(ulong)uVar40,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_16d8._M_dataplus._M_p,(uint)local_16d8._M_string_length,
               local_a0._M_impl._M_node._M_size);
    pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_16d8,0,0,"nogoods_size = ",0xf);
    DVar7 = _local_1738;
    auVar9 = _auStack_1730;
    local_1738 = (undefined1  [8])p_Var33;
    DVar8 = _local_1738;
    local_1738 = (undefined1  [8])(pbVar29->_M_dataplus)._M_p;
    paVar41 = &pbVar29->field_2;
    p_Stack_1720 = (_Base_ptr)DVar7._M_invoker;
    p_Var24 = p_Stack_1720;
    if (local_1738 == (undefined1  [8])paVar41) {
      _local_1738 = DVar8.super__Function_base._M_functor;
      auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
      p_Stack_1720 = (_Base_ptr)*(_Invoker_type *)((long)&pbVar29->field_2 + 8);
    }
    else {
      _local_1738 = (DuplicateSolutionFilterer)CONCAT248(auVar9,local_1738);
      auStack_1730._8_8_ = (_Manager_type)paVar41->_M_allocated_capacity;
      _local_1738 = (DuplicateSolutionFilterer)CONCAT824(p_Var24,_local_1738);
    }
    auStack_1730._0_8_ = pbVar29->_M_string_length;
    (pbVar29->_M_dataplus)._M_p = (pointer)paVar41;
    pbVar29->_M_string_length = 0;
    (pbVar29->field_2)._M_local_buf[0] = '\0';
    p_Var30 = (_List_node_base *)operator_new(0x30);
    p_Var30[1]._M_next = p_Var30 + 2;
    if (local_1738 == (undefined1  [8])p_Var33) {
      p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
      p_Var30[2]._M_prev = (_List_node_base *)p_Stack_1720;
    }
    else {
      p_Var30[1]._M_next = (_List_node_base *)local_1738;
      p_Var30[2]._M_next = (_List_node_base *)auStack_1730._8_8_;
    }
    p_Var30[1]._M_prev = (_List_node_base *)auStack_1730._0_8_;
    _local_1738 = ZEXT817(p_Var33);
    std::__detail::_List_node_base::_M_hook(p_Var30);
    local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
    if (local_1738 != (undefined1  [8])p_Var33) {
      operator_delete((void *)local_1738,(ulong)((long)(_Rb_tree_color *)auStack_1730._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
      operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
    }
    local_1718 = (_Base_ptr)(local_1738 + 8);
    auStack_1730._0_4_ = 0;
    auStack_1730._8_8_ = (_Manager_type)0x0;
    p_Stack_1720 = local_1718;
    local_1710 = 0;
    if (local_a0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_a0) {
      p_Var33 = local_a0._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_16d8._M_dataplus._M_p._0_4_ =
             (int)((ulong)((long)p_Var33[1]._M_prev - (long)p_Var33[1]._M_next) >> 3);
        pmVar32 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_1738,(key_type *)&local_16d8);
        *pmVar32 = *pmVar32 + 1;
        p_Var33 = (((_List_impl *)&p_Var33->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var33 != (_List_node_base *)&local_a0);
    }
    local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
    local_16d8._M_string_length = 0;
    local_16d8.field_2._M_allocated_capacity =
         local_16d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (p_Stack_1720 != (_Rb_tree_node_base *)(local_1738 + 8)) {
      p_Var24 = p_Stack_1720;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_16d8," ");
        _Var3 = p_Var24[1]._M_color;
        __val = -_Var3;
        if (0 < (int)_Var3) {
          __val = _Var3;
        }
        uVar40 = 1;
        if (9 < __val) {
          uVar44 = (ulong)__val;
          uVar21 = 4;
          do {
            uVar40 = uVar21;
            uVar45 = (uint)uVar44;
            if (uVar45 < 100) {
              uVar40 = uVar40 - 2;
              goto LAB_0011b8e8;
            }
            if (uVar45 < 1000) {
              uVar40 = uVar40 - 1;
              goto LAB_0011b8e8;
            }
            if (uVar45 < 10000) goto LAB_0011b8e8;
            uVar44 = uVar44 / 10000;
            uVar21 = uVar40 + 4;
          } while (99999 < uVar45);
          uVar40 = uVar40 + 1;
        }
LAB_0011b8e8:
        local_1540._M_dataplus._M_p = (pointer)&local_1540.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_1540,(ulong)(uVar40 + -((int)_Var3 >> 0x1f)),'-');
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1540._M_dataplus._M_p + (uint)-((int)_Var3 >> 0x1f),uVar40,__val);
        pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_1540,":");
        local_15b8._M_dataplus._M_p = (pointer)&local_15b8.field_2;
        paVar41 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar29->_M_dataplus)._M_p;
        paVar35 = &pbVar29->field_2;
        if (paVar41 == paVar35) {
          local_15b8.field_2._M_allocated_capacity = paVar35->_M_allocated_capacity;
          local_15b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar29->field_2 + 8);
        }
        else {
          local_15b8.field_2._M_allocated_capacity = paVar35->_M_allocated_capacity;
          local_15b8._M_dataplus._M_p = (pointer)paVar41;
        }
        local_15b8._M_string_length = pbVar29->_M_string_length;
        (pbVar29->_M_dataplus)._M_p = (pointer)paVar35;
        pbVar29->_M_string_length = 0;
        (pbVar29->field_2)._M_local_buf[0] = '\0';
        uVar40 = *(uint *)&p_Var24[1].field_0x4;
        uVar21 = -uVar40;
        if (0 < (int)uVar40) {
          uVar21 = uVar40;
        }
        uVar45 = 1;
        if (9 < uVar21) {
          uVar44 = (ulong)uVar21;
          uVar36 = 4;
          do {
            uVar45 = uVar36;
            uVar22 = (uint)uVar44;
            if (uVar22 < 100) {
              uVar45 = uVar45 - 2;
              goto LAB_0011b9ec;
            }
            if (uVar22 < 1000) {
              uVar45 = uVar45 - 1;
              goto LAB_0011b9ec;
            }
            if (uVar22 < 10000) goto LAB_0011b9ec;
            uVar44 = uVar44 / 10000;
            uVar36 = uVar45 + 4;
          } while (99999 < uVar22);
          uVar45 = uVar45 + 1;
        }
LAB_0011b9ec:
        local_1598._M_dataplus._M_p = (pointer)&local_1598.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_1598,(ulong)(uVar45 + -((int)uVar40 >> 0x1f)),'-');
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1598._M_dataplus._M_p + (uint)-((int)uVar40 >> 0x1f),uVar45,uVar21);
        uVar23 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
          uVar23 = local_15b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < local_1598._M_string_length + local_15b8._M_string_length) {
          uVar23 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
            uVar23 = local_1598.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar23 < local_1598._M_string_length + local_15b8._M_string_length)
          goto LAB_0011ba99;
          pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace(&local_1598,0,0,local_15b8._M_dataplus._M_p,
                              local_15b8._M_string_length);
        }
        else {
LAB_0011ba99:
          pbVar29 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_15b8,local_1598._M_dataplus._M_p,local_1598._M_string_length)
          ;
        }
        local_1688._M_dataplus._M_p = (pbVar29->_M_dataplus)._M_p;
        paVar41 = &pbVar29->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1688._M_dataplus._M_p == paVar41) {
          local_1688.field_2._M_allocated_capacity = paVar41->_M_allocated_capacity;
          local_1688.field_2._8_8_ = *(undefined8 *)((long)&pbVar29->field_2 + 8);
          local_1688._M_dataplus._M_p = (pointer)&local_1688.field_2;
        }
        else {
          local_1688.field_2._M_allocated_capacity = paVar41->_M_allocated_capacity;
        }
        local_1688._M_string_length = pbVar29->_M_string_length;
        (pbVar29->_M_dataplus)._M_p = (pointer)paVar41;
        pbVar29->_M_string_length = 0;
        paVar41->_M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_16d8,local_1688._M_dataplus._M_p,local_1688._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1688._M_dataplus._M_p != &local_1688.field_2) {
          operator_delete(local_1688._M_dataplus._M_p,
                          (ulong)(local_1688.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
          operator_delete(local_1598._M_dataplus._M_p,local_1598.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
          operator_delete(local_15b8._M_dataplus._M_p,local_15b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1540._M_dataplus._M_p != &local_1540.field_2) {
          operator_delete(local_1540._M_dataplus._M_p,local_1540.field_2._M_allocated_capacity + 1);
        }
        p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
      } while (p_Var24 != (_Rb_tree_node_base *)(local_1738 + 8));
    }
    std::operator+(&local_1688,"nogoods_lengths =",&local_16d8);
    p_Var33 = (_List_node_base *)operator_new(0x30);
    p_Var33[1]._M_next = p_Var33 + 2;
    paVar41 = &local_1688.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1688._M_dataplus._M_p == paVar41) {
      p_Var33[2]._M_next = (_List_node_base *)local_1688.field_2._M_allocated_capacity;
      p_Var33[2]._M_prev = (_List_node_base *)local_1688.field_2._8_8_;
    }
    else {
      p_Var33[1]._M_next = (_List_node_base *)local_1688._M_dataplus._M_p;
      p_Var33[2]._M_next = (_List_node_base *)local_1688.field_2._M_allocated_capacity;
    }
    p_Var33[1]._M_prev = (_List_node_base *)local_1688._M_string_length;
    local_1688._M_string_length = 0;
    local_1688.field_2._M_allocated_capacity =
         local_1688.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1688._M_dataplus._M_p = (pointer)paVar41;
    std::__detail::_List_node_base::_M_hook(p_Var33);
    local_15f8 = (_List_node_base *)((long)&local_15f8->_M_next + 1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1688._M_dataplus._M_p != paVar41) {
      operator_delete(local_1688._M_dataplus._M_p,
                      (ulong)(local_1688.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
      operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)local_1738);
  }
  innards::HomomorphismModel::add_extra_stats
            ((HomomorphismModel *)local_1668._M_unused._0_8_,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1608);
  p_Var33 = local_50._M_next;
  while (p_Var30 = local_68._M_next, p_Var33 != &local_50) {
    p_Var30 = p_Var33->_M_next;
    operator_delete(p_Var33,0x18);
    p_Var33 = p_Var30;
  }
  while (p_Var30 != &local_68) {
    p_Var33 = p_Var30->_M_next;
    operator_delete(p_Var30,0x18);
    p_Var30 = p_Var33;
  }
  std::
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  ::~vector(&local_80);
  std::__cxx11::
  _List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
  ::_M_clear(&local_a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(aPStack_1438[1]._imp._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl._1_7_,
               aPStack_1438[1]._imp._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(aPStack_1438[1]._imp._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl._1_7_
                        ,aPStack_1438[1]._imp._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl.
                         _0_1_));
  }
  if ((code *)CONCAT44(uStack_1444,local_1448) != (code *)0x0) {
    (*(code *)CONCAT44(uStack_1444,local_1448))(auStack_1458,auStack_1458,3);
  }
  if ((pointer)local_1518._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1518._0_8_,local_1518._16_8_ - local_1518._0_8_);
  }
LAB_0011bd84:
  std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
  ~vector((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           *)&local_1700);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)__return_storage_ptr__);
  if (_Stack_1640._M_parent != (_Base_ptr)0x0) {
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_1640._M_color;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_1640._M_parent;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_1640._M_left;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_1640._M_right;
    (_Stack_1640._M_parent)->_M_parent = local_14f0;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_1620._0_8_;
    _Stack_1640._M_parent = (_Base_ptr)0x0;
    _Stack_1640._M_left = (_Base_ptr)(local_1648 + 8);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_1620._8_8_;
    local_1620 = auVar47 << 0x40;
    _Stack_1640._M_right = (_Base_ptr)(local_1648 + 8);
  }
  __return_storage_ptr__->nodes = local_1620._8_8_;
  __return_storage_ptr__->propagations = local_1610;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(local_1520,local_1608);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::operator=(local_14e8,
              (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_15e8.ld);
  __return_storage_ptr__->complete = local_15c8;
  if ((local_15d4._1_1_ == false) && (local_15d2 == false)) {
    operator_delete(local_15e8.ld.data,(local_15e8.la[0] & 0xffffffff) << 3);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1608);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_1648);
  this._M_pi = sStack_1658.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
joined_r0x0011be94:
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  if ((Proof *)local_16a8._0_8_ != (Proof *)0x0) {
    if ((__return_storage_ptr__->complete == true) &&
       ((__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
      innards::Proof::finish_unsat_proof((Proof *)local_16a8._0_8_);
    }
    else if ((__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
            ) {
      innards::Proof::finish_unknown_proof((Proof *)local_16a8._0_8_);
    }
    else {
      innards::Proof::finish_sat_proof((Proof *)local_16a8._0_8_);
    }
  }
  goto LAB_0011beda;
}

Assistant:

auto gss::solve_homomorphism_problem(
    const InputGraph & pattern,
    const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    // start by setting up proof logging, if necessary
    shared_ptr<Proof> proof;
    if (params.proof_options) {
        // proof logging is currently incompatible with a whole load of "extra" features,
        // but can be adapted to support most of them
        if (1 != params.n_threads)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with threads"};
        if (params.clique_detection)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with clique detection, use --no-clique-detection"};
        if (params.lackey)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with a lackey"};
        if (! params.pattern_less_constraints.empty() || ! params.target_occur_less_constraints.empty())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with less-constraints"};
        if (params.injectivity != Injectivity::Injective && params.injectivity != Injectivity::NonInjective)
            throw UnsupportedConfiguration{"Proof logging can currently only be used with injectivity or non-injectivity"};
        if (pattern.has_vertex_labels() || pattern.has_edge_labels())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used on labelled graphs"};

        proof = make_shared<Proof>(*params.proof_options);

        // set up our model file, with a set of OPB variables for each CP variable
        for (int n = 0; n < pattern.size(); ++n) {
            proof->create_cp_variable(
                n, target.size(),
                [&](int v) { return pattern.vertex_name(v); },
                [&](int v) { return target.vertex_name(v); });
        }

        // generate constraints for injectivity
        if (params.injectivity == Injectivity::Injective)
            proof->create_injectivity_constraints(pattern.size(), target.size());

        // generate edge constraints, and also handle loops here
        for (int p = 0; p < pattern.size(); ++p) {
            for (int t = 0; t < target.size(); ++t) {
                // it's simpler to always have the adjacency constraints, even
                // if the assignment is forbidden
                proof->start_adjacency_constraints_for(p, t);

                // if p can be mapped to t, then each neighbour of p...
                for (int q = 0; q < pattern.size(); ++q)
                    if (pattern.adjacent(p, q)) {
                        // ... must be mapped to a neighbour of t
                        vector<int> permitted, cancel_out;
                        for (int u = 0; u < target.size(); ++u)
                            if (target.adjacent(t, u)) {
                                permitted.push_back(u);
                                if (t == u)
                                    cancel_out.push_back(t);
                            }
                        proof->create_adjacency_constraint(p, q, t, permitted, cancel_out, false);
                    }

                // same for non-adjacency for induced
                if (params.induced) {
                    for (int q = 0; q < pattern.size(); ++q)
                        if (q != p && ! pattern.adjacent(p, q)) {
                            // ... must be mapped to a neighbour of t
                            vector<int> permitted;
                            for (int u = 0; u < target.size(); ++u)
                                if (t != u && ! target.adjacent(t, u))
                                    permitted.push_back(u);
                            proof->create_adjacency_constraint(p, q, t, permitted, vector<int>{}, true);
                        }
                }
            }
        }

        // output the model file
        proof->finalise_model();
    }

    // first sanity check: if we're finding an injective mapping, and there
    // aren't enough vertices, fail immediately.
    if (is_nonshrinking(params) && (pattern.size() > target.size())) {
        if (proof) {
            proof->failure_due_to_pattern_bigger_than_target();
            proof->finish_unsat_proof();
        }

        return HomomorphismResult{};
    }

    // does the target have loops, and are we looking for a single non-injective mapping?
    if ((params.injectivity == Injectivity::NonInjective) && ! pattern.has_vertex_labels() && ! pattern.has_edge_labels() && target.loopy() && ! params.count_solutions && ! params.enumerate_callback) {
        HomomorphismResult result;
        result.extra_stats.emplace_back("used_loops_property = true");
        result.complete = true;
        int loop = -1;
        for (int t = 0; t < target.size(); ++t)
            if (target.adjacent(t, t)) {
                loop = t;
                break;
            }

        for (int n = 0; n < pattern.size(); ++n)
            result.mapping.emplace(n, loop);

        ++result.solution_count;

        return result;
    }

    // is the pattern a clique? if so, use a clique algorithm instead
    if (can_use_clique(params) && is_simple_clique(pattern)) {
        CliqueParams clique_params;
        clique_params.timeout = params.timeout;
        clique_params.start_time = params.start_time;
        clique_params.decide = make_optional(pattern.size());
        clique_params.restarts_schedule = make_unique<NoRestartsSchedule>();
        auto clique_result = solve_clique_problem(target, clique_params);

        // now translate the result back into what we expect
        HomomorphismResult result;
        int v = 0;
        for (auto & m : clique_result.clique) {
            result.mapping.emplace(v++, m);
            // the clique solver can find a bigger clique than we ask for
            if (v >= pattern.size())
                break;
        }
        result.nodes = clique_result.nodes;
        result.extra_stats = move(clique_result.extra_stats);
        result.extra_stats.emplace_back("used_clique_solver = true");
        result.complete = clique_result.complete;

        return result;
    }
    else {
        // just solve the problem
        HomomorphismModel model(target, pattern, params, proof);

        if (! model.prepare()) {
            HomomorphismResult result;
            result.extra_stats.emplace_back("model_consistent = false");
            result.complete = true;
            if (proof)
                proof->finish_unsat_proof();
            return result;
        }

        HomomorphismResult result;
        if (1 == params.n_threads) {
            SequentialSolver solver(model, params, proof);
            result = solver.solve();
        }
        else {
            if (! params.restarts_schedule->might_restart())
                throw UnsupportedConfiguration{"Threaded search requires restarts"};

            unsigned n_threads = how_many_threads(params.n_threads);
            ThreadedSolver solver(model, params, proof, n_threads);
            result = solver.solve();
        }

        if (proof) {
            if (result.complete && result.mapping.empty())
                proof->finish_unsat_proof();
            else if (! result.mapping.empty())
                proof->finish_sat_proof();
            else
                proof->finish_unknown_proof();
        }

        return result;
    }
}